

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void aom_get_var_sse_sum_16x16_dual_sse2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse16x16,
               uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [13];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  int i;
  int iVar27;
  undefined1 (*pauVar28) [16];
  undefined1 (*pauVar29) [16];
  uint32_t *sse;
  uint *sum;
  int k;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i vsse;
  __m128i vsum;
  int sum16x16 [2];
  
  sum16x16[0] = 0;
  sum16x16[1] = 0;
  sse = sse16x16;
  sum = tot_sse;
  for (lVar30 = 0; lVar30 != 2; lVar30 = lVar30 + 1) {
    iVar27 = 0x10;
    pauVar28 = (undefined1 (*) [16])ref_ptr;
    pauVar29 = (undefined1 (*) [16])src_ptr;
    while (bVar31 = iVar27 != 0, iVar27 = iVar27 + -1, bVar31) {
      auVar1 = *pauVar29;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar1._0_13_;
      auVar4[0xe] = auVar1[7];
      auVar6[0xc] = auVar1[6];
      auVar6._0_12_ = auVar1._0_12_;
      auVar6._13_2_ = auVar4._13_2_;
      auVar8[0xb] = 0;
      auVar8._0_11_ = auVar1._0_11_;
      auVar8._12_3_ = auVar6._12_3_;
      auVar10[10] = auVar1[5];
      auVar10._0_10_ = auVar1._0_10_;
      auVar10._11_4_ = auVar8._11_4_;
      auVar12[9] = 0;
      auVar12._0_9_ = auVar1._0_9_;
      auVar12._10_5_ = auVar10._10_5_;
      auVar14[8] = auVar1[4];
      auVar14._0_8_ = auVar1._0_8_;
      auVar14._9_6_ = auVar12._9_6_;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = auVar14._8_7_;
      Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),auVar1[3]);
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var16;
      auVar17._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar17[0] = auVar1[2];
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar17;
      auVar18._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar18[0] = auVar1[1];
      auVar2 = *pauVar28;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar2._0_13_;
      auVar3[0xe] = auVar2[7];
      auVar5[0xc] = auVar2[6];
      auVar5._0_12_ = auVar2._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar2._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar2[5];
      auVar9._0_10_ = auVar2._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar2._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = auVar2[4];
      auVar13._0_8_ = auVar2._0_8_;
      auVar13._9_6_ = auVar11._9_6_;
      auVar19._7_8_ = 0;
      auVar19._0_7_ = auVar13._8_7_;
      Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),auVar2[3]);
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var20;
      auVar21._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar21[0] = auVar2[2];
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar21;
      auVar22._1_12_ = SUB1512(auVar26 << 0x20,3);
      auVar22[0] = auVar2[1];
      auVar33._0_2_ = (ushort)auVar1[0] - (ushort)auVar2[0];
      auVar33._2_2_ = auVar18._0_2_ - auVar22._0_2_;
      auVar33._4_2_ = auVar17._0_2_ - auVar21._0_2_;
      auVar33._6_2_ = (short)Var16 - (short)Var20;
      auVar33._8_2_ = auVar14._8_2_ - auVar13._8_2_;
      auVar33._10_2_ = auVar10._10_2_ - auVar9._10_2_;
      auVar33._12_2_ = auVar6._12_2_ - auVar5._12_2_;
      auVar33._14_2_ = (auVar4._13_2_ >> 8) - (auVar3._13_2_ >> 8);
      auVar32._0_2_ = (ushort)auVar1[8] - (ushort)auVar2[8];
      auVar32._2_2_ = (ushort)auVar1[9] - (ushort)auVar2[9];
      auVar32._4_2_ = (ushort)auVar1[10] - (ushort)auVar2[10];
      auVar32._6_2_ = (ushort)auVar1[0xb] - (ushort)auVar2[0xb];
      auVar32._8_2_ = (ushort)auVar1[0xc] - (ushort)auVar2[0xc];
      auVar32._10_2_ = (ushort)auVar1[0xd] - (ushort)auVar2[0xd];
      auVar32._12_2_ = (ushort)auVar1[0xe] - (ushort)auVar2[0xe];
      auVar32._14_2_ = (ushort)auVar1[0xf] - (ushort)auVar2[0xf];
      pmaddwd(auVar33,auVar33);
      pmaddwd(auVar32,auVar32);
      pauVar29 = (undefined1 (*) [16])(*pauVar29 + src_stride);
      pauVar28 = (undefined1 (*) [16])(*pauVar28 + ref_stride);
    }
    vsse[1] = sum16x16 + lVar30;
    vsse[0] = (longlong)(sse16x16 + lVar30);
    vsum[1] = (longlong)pauVar28;
    vsum[0] = (longlong)pauVar29;
    variance_final_256_pel_sse2(vsse,vsum,sse,(int *)sum);
    src_ptr = (uint8_t *)((long)src_ptr + 0x10);
    ref_ptr = (uint8_t *)((long)ref_ptr + 0x10);
  }
  *tot_sse = *tot_sse + sse16x16[1] + *sse16x16;
  *tot_sum = *tot_sum + sum16x16[1] + sum16x16[0];
  for (lVar30 = 0; lVar30 != 2; lVar30 = lVar30 + 1) {
    var16x16[lVar30] =
         sse16x16[lVar30] - (int)((ulong)((long)sum16x16[lVar30] * (long)sum16x16[lVar30]) >> 8);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_sse2(const uint8_t *src_ptr, int src_stride,
                                         const uint8_t *ref_ptr, int ref_stride,
                                         uint32_t *sse16x16,
                                         unsigned int *tot_sse, int *tot_sum,
                                         uint32_t *var16x16) {
  int sum16x16[2] = { 0 };
  // Loop over 2 16x16 blocks. Process one 16x32 block.
  for (int k = 0; k < 2; k++) {
    const uint8_t *src = src_ptr;
    const uint8_t *ref = ref_ptr;
    __m128i vsum = _mm_setzero_si128();
    __m128i vsse = _mm_setzero_si128();
    for (int i = 0; i < 16; i++) {
      __m128i s[2];
      __m128i r[2];
      load16_8to16_sse2(src + (k * 16), s);
      load16_8to16_sse2(ref + (k * 16), r);
      const __m128i diff0 = _mm_sub_epi16(s[0], r[0]);
      const __m128i diff1 = _mm_sub_epi16(s[1], r[1]);
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff0, diff0));
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff1, diff1));
      vsum = _mm_add_epi16(vsum, _mm_add_epi16(diff0, diff1));
      src += src_stride;
      ref += ref_stride;
    }
    variance_final_256_pel_sse2(vsse, vsum, &sse16x16[k], &sum16x16[k]);
  }

  // Calculate variance at 16x16 level and total sse, sum of 16x32 block.
  *tot_sse += sse16x16[0] + sse16x16[1];
  *tot_sum += sum16x16[0] + sum16x16[1];
  for (int i = 0; i < 2; i++)
    var16x16[i] =
        sse16x16[i] - (uint32_t)(((int64_t)sum16x16[i] * sum16x16[i]) >> 8);
}